

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::global_print_newline(vw *all)

{
  ssize_t sVar1;
  int *piVar2;
  char *__s;
  size_t sVar3;
  ulong uVar4;
  char temp [1];
  undefined1 local_31;
  
  piVar2 = (all->final_prediction_sink)._begin;
  if ((all->final_prediction_sink)._end != piVar2) {
    uVar4 = 0;
    do {
      sVar1 = io_buf::write_file_or_socket(piVar2[uVar4],&local_31,1);
      if (sVar1 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"write error: ",0xd);
        piVar2 = __errno_location();
        __s = strerror(*piVar2);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d4a18);
        }
        else {
          sVar3 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      uVar4 = uVar4 + 1;
      piVar2 = (all->final_prediction_sink)._begin;
    } while (uVar4 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void global_print_newline(vw& all)
{
  char temp[1];
  temp[0] = '\n';
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = all.final_prediction_sink[i];
    ssize_t t;
    t = io_buf::write_file_or_socket(f, temp, 1);
    if (t != 1)
      cerr << "write error: " << strerror(errno) << endl;
  }
}